

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlAttributePtr xmlGetDtdAttrDesc(xmlDtdPtr dtd,xmlChar *elem,xmlChar *name)

{
  xmlChar *local_48;
  xmlChar *prefix;
  xmlChar *localname;
  xmlAttributePtr cur;
  xmlAttributeTablePtr table;
  xmlChar *name_local;
  xmlChar *elem_local;
  xmlDtdPtr dtd_local;
  
  local_48 = (xmlChar *)0x0;
  if ((((dtd == (xmlDtdPtr)0x0) || (dtd->attributes == (void *)0x0)) || (elem == (xmlChar *)0x0)) ||
     (name == (xmlChar *)0x0)) {
    dtd_local = (xmlDtdPtr)0x0;
  }
  else {
    cur = (xmlAttributePtr)dtd->attributes;
    if (cur == (xmlAttributePtr)0x0) {
      dtd_local = (xmlDtdPtr)0x0;
    }
    else {
      table = (xmlAttributeTablePtr)name;
      name_local = elem;
      elem_local = (xmlChar *)dtd;
      prefix = xmlSplitQName4(name,&local_48);
      if (prefix == (xmlChar *)0x0) {
        dtd_local = (xmlDtdPtr)0x0;
      }
      else {
        localname = (xmlChar *)xmlHashLookup3((xmlHashTablePtr)cur,prefix,local_48,name_local);
        if (local_48 != (xmlChar *)0x0) {
          (*xmlFree)(local_48);
        }
        dtd_local = (xmlDtdPtr)localname;
      }
    }
  }
  return (xmlAttributePtr)dtd_local;
}

Assistant:

xmlAttributePtr
xmlGetDtdAttrDesc(xmlDtdPtr dtd, const xmlChar *elem, const xmlChar *name) {
    xmlAttributeTablePtr table;
    xmlAttributePtr cur;
    const xmlChar *localname;
    xmlChar *prefix = NULL;

    if ((dtd == NULL) || (dtd->attributes == NULL) ||
        (elem == NULL) || (name == NULL))
        return(NULL);

    table = (xmlAttributeTablePtr) dtd->attributes;
    if (table == NULL)
	return(NULL);

    localname = xmlSplitQName4(name, &prefix);
    if (localname == NULL)
        return(NULL);
    cur = xmlHashLookup3(table, localname, prefix, elem);
    if (prefix != NULL)
        xmlFree(prefix);
    return(cur);
}